

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O3

void CheckStackTraceLeaf(int i)

{
  uint uVar1;
  uint uVar2;
  void *__ptr;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  void *unaff_retaddr;
  char *pcVar10;
  undefined1 local_50 [8];
  vector<void_*,_std::allocator<void_*>_> stack;
  
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_50,(long)leaf_capture_len + 1,
             (allocator_type *)
             ((long)&stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = leaf_capture_len;
  *(void **)((long)local_50 + (long)leaf_capture_len * 8) = (void *)0x42;
  if (expected_range[1].start < unaff_retaddr) {
    if (expected_range[1].end < unaff_retaddr) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[1].start,expected_range[1].end
             ,expected_range[1].start,unaff_retaddr);
      expected_range[1].end = unaff_retaddr;
      iVar4 = leaf_capture_len;
    }
    uVar2 = (*leaf_capture_fn)((void **)local_50,iVar4);
    if (*(void **)((long)local_50 + (long)leaf_capture_len * 8) == (void *)0x42) {
      __ptr = (void *)backtrace_symbols(local_50,uVar2);
      if ((int)uVar2 < 1) {
        printf("CheckStackTrace() addr: %p\n",CheckStackTrace);
        free(__ptr);
      }
      else {
        uVar7 = 0;
        do {
          printf("%s %p\n",*(undefined8 *)((long)__ptr + uVar7 * 8),
                 *(void **)((long)local_50 + uVar7 * 8));
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
        printf("CheckStackTrace() addr: %p\n",CheckStackTrace);
        free(__ptr);
        if (0 < (int)uVar2) {
          uVar8 = 0;
          uVar7 = 1;
          do {
            uVar1 = 1;
            if (uVar8 != 1 || uVar7 != 2) {
              printf("Backtrace %d: expected: %p..%p  actual: %p ... ",(ulong)uVar8,
                     expected_range[(int)uVar8].start,expected_range[(int)uVar8].end,
                     *(void **)((long)local_50 + (uVar7 - 1) * 8));
              fflush(_stdout);
              CheckRetAddrIsInFunction
                        (*(void **)((long)local_50 + (uVar7 - 1) * 8),expected_range + (int)uVar8);
              puts("OK");
              uVar1 = uVar8 + 1;
            }
            uVar8 = uVar1;
          } while (((int)uVar8 < 6) && (bVar9 = uVar7 < uVar2, uVar7 = uVar7 + 1, bVar9));
        }
      }
      if (local_50 != (undefined1  [8])0x0) {
        operator_delete((void *)local_50,
                        (long)stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)local_50);
      }
      return;
    }
    pcVar10 = "(void*)0x42";
    pcVar5 = "stack[leaf_capture_len]";
    pcVar6 = "==";
    uVar3 = 0x11d;
  }
  else {
    pcVar10 = "ra";
    pcVar5 = "(&expected_range[1])->start";
    pcVar6 = "<";
    uVar3 = 0x11a;
  }
  fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
          ,uVar3,pcVar5,pcVar6,pcVar10);
  abort();
}

Assistant:

void ATTRIBUTE_NOINLINE CheckStackTraceLeaf(int i) {
  std::vector<void*> stack(leaf_capture_len + 1);
  stack[leaf_capture_len] = (void*)0x42;  // we will check that this value is not overwritten
  int size = 0;

  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[1]);

  size = leaf_capture_fn(stack.data(), leaf_capture_len);
  CHECK_EQ(stack[leaf_capture_len], (void*)0x42);

#ifdef HAVE_EXECINFO_H
  {
    char **strings = backtrace_symbols(stack.data(), size);
    for (int i = 0; i < size; i++)
      printf("%s %p\n", strings[i], stack[i]);
    printf("CheckStackTrace() addr: %p\n", &CheckStackTrace);
    free(strings);
  }
#endif

  for (int i = 0, j = 0; i < BACKTRACE_STEPS && j < size; i++, j++) {
    if (i == 1 && j == 1) {
      // this is expected to be our function for which we don't
      // establish bounds. So skip.
      i--;
      continue;
    }
    printf("Backtrace %d: expected: %p..%p  actual: %p ... ",
           i, expected_range[i].start, expected_range[i].end, stack[j]);
    fflush(stdout);
    CheckRetAddrIsInFunction(stack[j], expected_range[i]);
    printf("OK\n");
  }
}